

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutils.h
# Opt level: O1

string * rtrim(string *__return_storage_ptr__,string *str)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_40;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_40,"\\s+$",0x10);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __first._M_current = (str->_M_dataplus)._M_p;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + str->_M_string_length),&local_40,(char *)local_60,local_58,0);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_40);
  return __return_storage_ptr__;
}

Assistant:

string rtrim(const string& str) {
    return regex_replace(str, regex("\\s+$"), string(""));
}